

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<double,_std::allocator<double>_> *
clickhouse::SliceVector<double>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *vec,size_t begin,size_t len)

{
  pointer pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar1 = (vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  uVar3 = uVar2 - begin;
  if (begin <= uVar2 && uVar3 != 0) {
    if (uVar3 < len) {
      len = uVar3;
    }
    pdVar1 = pdVar1 + begin;
    std::vector<double,std::allocator<double>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              ((vector<double,std::allocator<double>> *)__return_storage_ptr__,pdVar1,pdVar1 + len);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> SliceVector(const std::vector<T>& vec, size_t begin, size_t len) {
    std::vector<T> result;

    if (begin < vec.size()) {
        len = std::min(len, vec.size() - begin);
        result.assign(vec.begin() + begin, vec.begin() + (begin + len));
    }

    return result;
}